

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O1

int utf8casecmp(void *src1,void *src2)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  int in_EAX;
  byte bVar4;
  
  do {
    bVar4 = *src1;
    if ((bVar4 == 0) && (*src2 == 0)) {
      return 0;
    }
    bVar1 = *src2;
    bVar2 = bVar4 | 0x20;
    if (0x19 < (byte)(bVar4 + 0xbf)) {
      bVar2 = bVar4;
    }
    bVar4 = bVar1 | 0x20;
    if (0x19 < (byte)(bVar1 + 0xbf)) {
      bVar4 = bVar1;
    }
    if (bVar2 < bVar4) {
      in_EAX = -1;
LAB_00111276:
      bVar3 = false;
    }
    else {
      if (bVar4 < bVar2) {
        in_EAX = 1;
        goto LAB_00111276;
      }
      src1 = (void *)((long)src1 + 1);
      src2 = (void *)((long)src2 + 1);
      bVar3 = true;
    }
    if (!bVar3) {
      return in_EAX;
    }
  } while( true );
}

Assistant:

int utf8casecmp(const void *src1, const void *src2) {
  const unsigned char *s1 = (const unsigned char *)src1;
  const unsigned char *s2 = (const unsigned char *)src2;

  while (('\0' != *s1) || ('\0' != *s2)) {
    unsigned char a = *s1;
    unsigned char b = *s2;

    if (('A' <= a) && ('Z' >= a)) {
      a |= 0x20; // make a lowercase
    }

    if (('A' <= b) && ('Z' >= b)) {
      b |= 0x20; // make b lowercase
    }

    if (a < b) {
      return -1;
    } else if (a > b) {
      return 1;
    }

    s1++;
    s2++;
  }

  // both utf8 strings matched
  return 0;
}